

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

type __thiscall
fmt::v5::internal::
arg_formatter_base<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::operator()
          (arg_formatter_base<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>
           *this,longdouble value)

{
  iterator iVar1;
  long in_RDI;
  arg_formatter_base<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>
  *in_stack_00000008;
  format_specs *in_stack_00000298;
  longdouble in_stack_000002a0;
  basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>
  *in_stack_000002b0;
  undefined2 in_stack_ffffffffffffffa0;
  undefined6 in_stack_ffffffffffffffa2;
  
  if (*(long *)(in_RDI + 0x10) == 0) {
    basic_format_specs<char>::basic_format_specs
              ((basic_format_specs<char> *)
               CONCAT62(in_stack_ffffffffffffffa2,in_stack_ffffffffffffffa0));
  }
  basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>::
  write_double<long_double>(in_stack_000002b0,in_stack_000002a0,in_stack_00000298);
  iVar1 = arg_formatter_base<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>::
          out(in_stack_00000008);
  return (type)iVar1.container;
}

Assistant:

typename std::enable_if<std::is_floating_point<T>::value, iterator>::type
      operator()(T value) {
    writer_.write_double(value, specs_ ? *specs_ : format_specs());
    return out();
  }